

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_359b51::BuildEngineImpl::decrementTaskWaitCount
          (BuildEngineImpl *this,TaskInfo *taskInfo)

{
  bool bVar1;
  pointer pBVar2;
  pointer pTVar3;
  TaskInfo *local_18;
  TaskInfo *taskInfo_local;
  BuildEngineImpl *this_local;
  
  taskInfo->waitCount = taskInfo->waitCount - 1;
  local_18 = taskInfo;
  taskInfo_local = (TaskInfo *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
  if (bVar1) {
    pBVar2 = std::
             unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
             ::operator->(&this->trace);
    pTVar3 = std::unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>::get
                       (&local_18->task);
    llbuild::core::BuildEngineTrace::updatedTaskWaitCount(pBVar2,pTVar3,local_18->waitCount);
  }
  if (local_18->waitCount == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
    if (bVar1) {
      pBVar2 = std::
               unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
               ::operator->(&this->trace);
      pTVar3 = std::unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>::get
                         (&local_18->task);
      llbuild::core::BuildEngineTrace::unblockedTask(pBVar2,pTVar3);
    }
    std::
    deque<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
    ::push_back(&this->readyTaskInfos,&local_18);
  }
  return;
}

Assistant:

void decrementTaskWaitCount(TaskInfo* taskInfo) {
    --taskInfo->waitCount;
    if (trace)
      trace->updatedTaskWaitCount(taskInfo->task.get(), taskInfo->waitCount);
    if (taskInfo->waitCount == 0) {
      if (trace)
        trace->unblockedTask(taskInfo->task.get());
      readyTaskInfos.push_back(taskInfo);
    }
  }